

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

uint gvr::anon_unknown_1::findOrStoreVertex
               (Mesh *mesh,
               set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
               *vni,int *vn,Vector3f *v,Vector3f *normal)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  float *pfVar5;
  bool bVar6;
  _Rb_tree_node_base *p_Var7;
  uint uVar8;
  VertexNormalIndex *__y;
  VertexNormalIndex *extraout_RDX;
  VertexNormalIndex *pVVar9;
  VertexNormalIndex *extraout_RDX_00;
  VertexNormalIndex *extraout_RDX_01;
  long lVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  undefined1 auVar13 [16];
  _Alloc_node __an;
  VertexNormalIndex local_78;
  Mesh *local_50;
  undefined1 local_48 [16];
  
  uVar3 = *vn;
  local_78.x = v->v[0];
  local_78.y = v->v[1];
  local_78.z = (float)((ulong)*(undefined8 *)(v->v + 1) >> 0x20);
  local_48 = ZEXT416((uint)v->v[0]);
  local_78.nx = normal->v[0];
  local_78.ny = (float)*(undefined8 *)(normal->v + 1);
  local_78.nz = (float)((ulong)*(undefined8 *)(normal->v + 1) >> 0x20);
  p_Var4 = (vni->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(vni->_M_t)._M_impl.super__Rb_tree_header;
  pVVar9 = (VertexNormalIndex *)vn;
  p_Var12 = &p_Var1->_M_header;
  local_78.index = uVar3;
  local_50 = mesh;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_00116599:
    if (p_Var12 != (vni->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      auVar13 = std::_Rb_tree_decrement(p_Var12);
      goto LAB_001165af;
    }
  }
  else {
    p_Var11 = &p_Var1->_M_header;
    p_Var12 = p_Var4;
    do {
      bVar6 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                        ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)(p_Var12 + 1),
                         &local_78,pVVar9);
      if (!bVar6) {
        p_Var11 = p_Var12;
      }
      p_Var12 = (&p_Var12->_M_left)[bVar6];
      pVVar9 = __y;
    } while (p_Var12 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (bVar6 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                          ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)&local_78,
                           (VertexNormalIndex *)(p_Var11 + 1),__y), pVVar9 = extraout_RDX, !bVar6))
    {
      return *(uint *)&p_Var11[1]._M_right;
    }
    do {
      p_Var12 = p_Var4;
      bVar6 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                        ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)&local_78,
                         (VertexNormalIndex *)(p_Var12 + 1),pVVar9);
      auVar13._8_8_ = extraout_RDX_00;
      auVar13._0_8_ = p_Var12;
      pVVar9 = extraout_RDX_00;
      p_Var4 = (&p_Var12->_M_left)[!bVar6];
    } while ((&p_Var12->_M_left)[!bVar6] != (_Base_ptr)0x0);
    if (bVar6) goto LAB_00116599;
LAB_001165af:
    bVar6 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                      ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)(auVar13._0_8_ + 0x20)
                       ,&local_78,auVar13._8_8_);
    pVVar9 = extraout_RDX_01;
    uVar8 = uVar3;
    if (!bVar6) goto LAB_00116630;
  }
  if (p_Var1 == (_Rb_tree_header *)p_Var12) {
    bVar6 = true;
  }
  else {
    bVar6 = std::less<gvr::(anonymous_namespace)::VertexNormalIndex>::operator()
                      ((less<gvr::(anonymous_namespace)::VertexNormalIndex> *)&local_78,
                       (VertexNormalIndex *)(p_Var12 + 1),pVVar9);
  }
  p_Var7 = (_Rb_tree_node_base *)operator_new(0x40);
  *(ulong *)(p_Var7 + 1) = CONCAT44(local_78.y,local_78.x);
  p_Var7[1]._M_parent = (_Base_ptr)CONCAT44(local_78.nx,local_78.z);
  *(ulong *)((long)&p_Var7[1]._M_parent + 4) = CONCAT44(local_78.ny,local_78.nx);
  *(ulong *)((long)&p_Var7[1]._M_left + 4) = CONCAT44(local_78.index,local_78.nz);
  std::_Rb_tree_insert_and_rebalance(bVar6,p_Var7,p_Var12,&p_Var1->_M_header);
  psVar2 = &(vni->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
  local_48._0_4_ = v->v[0];
  uVar8 = *vn;
LAB_00116630:
  pfVar5 = (local_50->super_PointCloud).vertex;
  lVar10 = (long)(int)(uVar8 * 3);
  pfVar5[lVar10] = (float)local_48._0_4_;
  pfVar5[lVar10 + 1] = v->v[1];
  pfVar5[lVar10 + 2] = v->v[2];
  *vn = uVar8 + 1;
  return uVar3;
}

Assistant:

unsigned int findOrStoreVertex(Mesh *mesh, std::set<VertexNormalIndex> &vni,
  int &vn, const gmath::Vector3f &v, const gmath::Vector3f &normal)
{
  // try to find point v in the vertex list of mesh, but it is only considered
  // a duplicate if the normals are the same


  VertexNormalIndex p(v, normal, vn);
  std::set<VertexNormalIndex>::iterator it=vni.find(p);

  // add the vertex, if a duplicate cannot be found

  if (it != vni.end())
  {
    return it->index;
  }
  else
  {
    vni.insert(p);
    mesh->setVertex(vn, v);
    vn++;

    return p.index;
  }
}